

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.h
# Opt level: O1

void __thiscall
google::protobuf::internal::MapSorterFlat<google::protobuf::Map<unsigned_long,_int>_>::MapSorterFlat
          (MapSorterFlat<google::protobuf::Map<unsigned_long,_int>_> *this,
          Map<unsigned_long,_int> *m)

{
  uint uVar1;
  uint uVar2;
  NodeBase **ppNVar3;
  long lVar4;
  pair<unsigned_long,_const_void_*> *__s;
  uint uVar5;
  ulong uVar6;
  NodeBase *pNVar7;
  pair<unsigned_long,_const_void_*> *ppVar8;
  ulong uVar9;
  
  uVar1 = (m->super_KeyMapBase<unsigned_long>).super_UntypedMapBase.num_elements_;
  uVar9 = (ulong)uVar1;
  this->size_ = uVar9;
  if (uVar9 == 0) {
    __s = (pair<unsigned_long,_const_void_*> *)0x0;
  }
  else {
    __s = (pair<unsigned_long,_const_void_*> *)operator_new__(uVar9 << 4);
    memset(__s,0,uVar9 << 4);
  }
  (this->items_)._M_t.
  super___uniq_ptr_impl<std::pair<unsigned_long,_const_void_*>,_std::default_delete<std::pair<unsigned_long,_const_void_*>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::pair<unsigned_long,_const_void_*>_*,_std::default_delete<std::pair<unsigned_long,_const_void_*>[]>_>
  .super__Head_base<0UL,_std::pair<unsigned_long,_const_void_*>_*,_false>._M_head_impl = __s;
  if (uVar9 != 0) {
    uVar2 = (m->super_KeyMapBase<unsigned_long>).super_UntypedMapBase.num_buckets_;
    uVar5 = (m->super_KeyMapBase<unsigned_long>).super_UntypedMapBase.index_of_first_non_null_;
    uVar6 = (ulong)uVar5;
    if (uVar5 == uVar2) {
      uVar6 = 0;
      pNVar7 = (NodeBase *)0x0;
    }
    else {
      pNVar7 = (m->super_KeyMapBase<unsigned_long>).super_UntypedMapBase.table_[uVar6];
      if (pNVar7 == (NodeBase *)0x0) {
        protobuf_assumption_failed
                  ("node != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                   ,0x22e);
      }
    }
    if (pNVar7 != (NodeBase *)0x0) {
      ppNVar3 = (m->super_KeyMapBase<unsigned_long>).super_UntypedMapBase.table_;
      ppVar8 = __s;
      do {
        ppVar8->first = (unsigned_long)pNVar7[1].next;
        ppVar8->second = pNVar7 + 1;
        pNVar7 = pNVar7->next;
        while (pNVar7 == (NodeBase *)0x0) {
          uVar5 = (int)uVar6 + 1;
          uVar6 = (ulong)uVar5;
          if (uVar2 <= uVar5) {
            pNVar7 = (NodeBase *)0x0;
            uVar6 = 0;
            break;
          }
          pNVar7 = ppNVar3[uVar5];
        }
        ppVar8 = ppVar8 + 1;
      } while (pNVar7 != (NodeBase *)0x0);
    }
    lVar4 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar1 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<std::pair<unsigned_long,void_const*>*,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::MapSorterLessThan<unsigned_long>>>
              (__s,__s + uVar9,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<std::pair<unsigned_long,void_const*>*,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::MapSorterLessThan<unsigned_long>>>
              (__s,__s + uVar9);
  }
  return;
}

Assistant:

explicit MapSorterFlat(const MapT& m)
      : size_(m.size()), items_(size_ ? new storage_type[size_] : nullptr) {
    if (!size_) return;
    storage_type* it = &items_[0];
    for (const auto& entry : m) {
      *it++ = {entry.first, &entry};
    }
    std::sort(&items_[0], &items_[size_],
              MapSorterLessThan<typename MapT::key_type>{});
  }